

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O3

void __thiscall QFSFileEngine::~QFSFileEngine(QFSFileEngine *this)

{
  int __fd;
  QFSFileEnginePrivate *this_00;
  int iVar1;
  int *piVar2;
  
  (this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine =
       (_func_int **)&PTR__QFSFileEngine_0017f510;
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  if (this_00->closeFileHandle == true) {
    if ((FILE *)this_00->fh == (FILE *)0x0) {
      __fd = this_00->fd;
      if (__fd != -1) {
        do {
          iVar1 = ::close(__fd);
          if (iVar1 != -1) break;
          piVar2 = __errno_location();
        } while (*piVar2 == 4);
      }
    }
    else {
      fclose((FILE *)this_00->fh);
    }
  }
  QFSFileEnginePrivate::unmapAll(this_00);
  QAbstractFileEngine::~QAbstractFileEngine(&this->super_QAbstractFileEngine);
  return;
}

Assistant:

QFSFileEngine::~QFSFileEngine()
{
    Q_D(QFSFileEngine);
    if (d->closeFileHandle) {
        if (d->fh) {
            fclose(d->fh);
        } else if (d->fd != -1) {
            QT_CLOSE(d->fd);
        }
    }
    d->unmapAll();
}